

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O3

int run_test_udp_send_and_recv(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  void *pvVar3;
  bool bVar4;
  long lVar6;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  uv_loop_t *unaff_RBX;
  uv__queue *puVar7;
  void **ppvVar8;
  uv_udp_t *puVar9;
  uv_loop_t *puVar10;
  uv_handle_t **__ptr;
  uv_loop_t *in_R8;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b;
  sockaddr_in addr;
  uv_udp_send_t req;
  void *pvStack_218;
  code *pcStack_210;
  uv_loop_t *puStack_208;
  void *pvStack_200;
  uv_loop_t *puStack_1f8;
  uv__queue *puStack_1e8;
  uv_handle_t *puStack_1e0;
  uv__queue *puStack_1d8;
  undefined1 auStack_1d0 [16];
  uv_alloc_cb p_Stack_1c0;
  uv_loop_t *puStack_1b8;
  undefined1 auStack_198 [24];
  undefined1 local_180 [16];
  uv__queue local_170;
  uv__queue *local_150;
  uv_loop_t *puVar5;
  
  auStack_198._8_8_ = (uv__queue *)0x1e090a;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&stack0xfffffffffffffea0);
  local_150 = (uv__queue *)(long)iVar1;
  local_170.next = (uv__queue *)0x0;
  if (local_150 == (uv__queue *)0x0) {
    auStack_198._8_8_ = (uv__queue *)0x1e092f;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1e093e;
    iVar1 = uv_udp_init(uVar2,&server);
    local_150 = (uv__queue *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150 != (uv__queue *)0x0) goto LAB_001e0cd1;
    auStack_198._8_8_ = (uv__queue *)0x1e0971;
    iVar1 = uv_udp_bind(&server,&stack0xfffffffffffffea0,0);
    local_150 = (uv__queue *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150 != (uv__queue *)0x0) goto LAB_001e0ce0;
    auStack_198._8_8_ = (uv__queue *)0x1e09ab;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    local_150 = (uv__queue *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150 != (uv__queue *)0x0) goto LAB_001e0cef;
    auStack_198._8_8_ = (uv__queue *)0x1e09e1;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&stack0xfffffffffffffea0);
    local_150 = (uv__queue *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150 != (uv__queue *)0x0) goto LAB_001e0cfe;
    auStack_198._8_8_ = (uv__queue *)0x1e0a06;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1e0a15;
    iVar1 = uv_udp_init(uVar2,&client);
    local_150 = (uv__queue *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150 != (uv__queue *)0x0) goto LAB_001e0d0d;
    auStack_198._8_8_ = (uv__queue *)0x1e0a46;
    local_170 = (uv__queue)uv_buf_init("PING",4);
    in_R8 = (uv_loop_t *)&stack0xfffffffffffffea0;
    auStack_198._8_8_ = (uv__queue *)0x1e0a77;
    iVar1 = uv_udp_send(&stack0xfffffffffffffeb0,&client,&local_170,1,in_R8,cl_send_cb);
    local_180._8_8_ = SEXT48(iVar1);
    local_180._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_180._8_8_ != (uv__queue *)0x0) goto LAB_001e0d1c;
    local_180._8_8_ = SEXT48(close_cb_called);
    local_180._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_180._8_8_ != (uv__queue *)0x0) goto LAB_001e0d2b;
    local_180._8_8_ = SEXT48(cl_send_cb_called);
    local_180._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_180._8_8_ != (uv__queue *)0x0) goto LAB_001e0d3a;
    local_180._8_8_ = SEXT48(cl_recv_cb_called);
    local_180._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_180._8_8_ != (uv__queue *)0x0) goto LAB_001e0d49;
    local_180._8_8_ = SEXT48(sv_send_cb_called);
    local_180._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_180._8_8_ != (uv__queue *)0x0) goto LAB_001e0d58;
    local_180._8_8_ = SEXT48(sv_recv_cb_called);
    local_180._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_180._8_8_ != (uv__queue *)0x0) goto LAB_001e0d67;
    auStack_198._8_8_ = (uv__queue *)0x1e0b55;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1e0b5f;
    uv_run(uVar2,0);
    local_180._8_8_ = (uv__queue *)0x1;
    local_180._0_8_ = SEXT48(cl_send_cb_called);
    if ((uv__queue *)local_180._0_8_ != (uv__queue *)0x1) goto LAB_001e0d76;
    local_180._8_8_ = (uv__queue *)0x1;
    local_180._0_8_ = SEXT48(cl_recv_cb_called);
    if ((uv__queue *)local_180._0_8_ != (uv__queue *)0x1) goto LAB_001e0d85;
    local_180._8_8_ = (uv__queue *)0x1;
    local_180._0_8_ = SEXT48(sv_send_cb_called);
    if ((uv__queue *)local_180._0_8_ != (uv__queue *)0x1) goto LAB_001e0d94;
    local_180._8_8_ = (uv__queue *)0x1;
    local_180._0_8_ = SEXT48(sv_recv_cb_called);
    if ((uv__queue *)local_180._0_8_ != (uv__queue *)0x1) goto LAB_001e0da3;
    local_180._8_8_ = (uv__queue *)0x2;
    local_180._0_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)local_180._0_8_ != (uv__queue *)0x2) goto LAB_001e0db2;
    local_180._8_8_ = client.send_queue_size;
    local_180._0_8_ = (uv__queue *)0x0;
    if (client.send_queue_size != 0) goto LAB_001e0dc1;
    local_180._8_8_ = server.send_queue_size;
    local_180._0_8_ = (uv__queue *)0x0;
    if (server.send_queue_size != 0) goto LAB_001e0dd0;
    auStack_198._8_8_ = (uv__queue *)0x1e0c67;
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1e0c7b;
    uv_walk(unaff_RBX,close_walk_cb,0);
    auStack_198._8_8_ = (uv__queue *)0x1e0c85;
    uv_run(unaff_RBX,0);
    local_180._8_8_ = (uv__queue *)0x0;
    auStack_198._8_8_ = (uv__queue *)0x1e0c93;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1e0c9b;
    iVar1 = uv_loop_close(uVar2);
    local_180._0_8_ = SEXT48(iVar1);
    if (local_180._8_8_ == local_180._0_8_) {
      auStack_198._8_8_ = (uv__queue *)0x1e0cb7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_198._8_8_ = (uv__queue *)0x1e0cd1;
    run_test_udp_send_and_recv_cold_1();
LAB_001e0cd1:
    auStack_198._8_8_ = (uv__queue *)0x1e0ce0;
    run_test_udp_send_and_recv_cold_2();
LAB_001e0ce0:
    auStack_198._8_8_ = (uv__queue *)0x1e0cef;
    run_test_udp_send_and_recv_cold_3();
LAB_001e0cef:
    auStack_198._8_8_ = (uv__queue *)0x1e0cfe;
    run_test_udp_send_and_recv_cold_4();
LAB_001e0cfe:
    auStack_198._8_8_ = (uv__queue *)0x1e0d0d;
    run_test_udp_send_and_recv_cold_5();
LAB_001e0d0d:
    auStack_198._8_8_ = (uv__queue *)0x1e0d1c;
    run_test_udp_send_and_recv_cold_6();
LAB_001e0d1c:
    auStack_198._8_8_ = (uv__queue *)0x1e0d2b;
    run_test_udp_send_and_recv_cold_7();
LAB_001e0d2b:
    auStack_198._8_8_ = (uv__queue *)0x1e0d3a;
    run_test_udp_send_and_recv_cold_8();
LAB_001e0d3a:
    auStack_198._8_8_ = (uv__queue *)0x1e0d49;
    run_test_udp_send_and_recv_cold_9();
LAB_001e0d49:
    auStack_198._8_8_ = (uv__queue *)0x1e0d58;
    run_test_udp_send_and_recv_cold_10();
LAB_001e0d58:
    auStack_198._8_8_ = (uv__queue *)0x1e0d67;
    run_test_udp_send_and_recv_cold_11();
LAB_001e0d67:
    auStack_198._8_8_ = (uv__queue *)0x1e0d76;
    run_test_udp_send_and_recv_cold_12();
LAB_001e0d76:
    auStack_198._8_8_ = (uv__queue *)0x1e0d85;
    run_test_udp_send_and_recv_cold_13();
LAB_001e0d85:
    auStack_198._8_8_ = (uv__queue *)0x1e0d94;
    run_test_udp_send_and_recv_cold_14();
LAB_001e0d94:
    auStack_198._8_8_ = (uv__queue *)0x1e0da3;
    run_test_udp_send_and_recv_cold_15();
LAB_001e0da3:
    auStack_198._8_8_ = (uv__queue *)0x1e0db2;
    run_test_udp_send_and_recv_cold_16();
LAB_001e0db2:
    auStack_198._8_8_ = (uv__queue *)0x1e0dc1;
    run_test_udp_send_and_recv_cold_17();
LAB_001e0dc1:
    auStack_198._8_8_ = (uv__queue *)0x1e0dd0;
    run_test_udp_send_and_recv_cold_18();
LAB_001e0dd0:
    auStack_198._8_8_ = (uv__queue *)0x1e0ddf;
    run_test_udp_send_and_recv_cold_19();
  }
  puVar9 = (uv_udp_t *)(local_180 + 8);
  puVar7 = (uv__queue *)local_180;
  auStack_198._8_8_ = alloc_cb;
  run_test_udp_send_and_recv_cold_20();
  bVar4 = puVar9 == &client || puVar9 == &server;
  puVar5 = (uv_loop_t *)CONCAT71(0xffda,bVar4);
  auStack_198._8_8_ = ZEXT18(bVar4);
  auStack_198._0_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStack_198._8_8_ == (uv__queue *)0x0) {
    alloc_cb_cold_2();
  }
  else {
    auStack_198._0_8_ = (uv__queue *)0x10000;
    auStack_198._8_8_ = puVar7;
    if ((long)puVar7 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return 0xffdaf0;
    }
  }
  puVar9 = (uv_udp_t *)(auStack_198 + 8);
  puVar7 = (uv__queue *)auStack_198;
  alloc_cb_cold_1();
  puStack_1b8 = unaff_RBX;
  if ((long)puVar7 < 0) {
    puStack_1e0 = (uv_handle_t *)0x1e0fe3;
    sv_recv_cb_cold_10();
    puVar5 = unaff_RBX;
LAB_001e0fe3:
    puStack_1e0 = (uv_handle_t *)0x1e0ff0;
    sv_recv_cb_cold_8();
LAB_001e0ff0:
    puStack_1e0 = (uv_handle_t *)0x1e0ffd;
    sv_recv_cb_cold_1();
LAB_001e0ffd:
    puStack_1e0 = (uv_handle_t *)0x1e1002;
    sv_recv_cb_cold_7();
LAB_001e1002:
    puStack_1e0 = (uv_handle_t *)0x1e100f;
    sv_recv_cb_cold_2();
LAB_001e100f:
    puStack_1e0 = (uv_handle_t *)0x1e1014;
    sv_recv_cb_cold_3();
LAB_001e1014:
    puStack_1e0 = (uv_handle_t *)0x1e1021;
    sv_recv_cb_cold_4();
LAB_001e1021:
    puStack_1e0 = (uv_handle_t *)0x1e1026;
    sv_recv_cb_cold_6();
LAB_001e1026:
    iVar1 = (int)&p_Stack_1c0;
    puStack_1e0 = (uv_handle_t *)0x1e1033;
    sv_recv_cb_cold_5();
  }
  else {
    if (puVar7 != (uv__queue *)0x0) {
      auStack_1d0._0_8_ = ZEXT18(puVar9 == &client || puVar9 == &server);
      puStack_1d8 = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_1d0._0_8_ == (uv_handle_t *)0x0) goto LAB_001e0fe3;
      auStack_1d0._0_8_ = (ulong)in_R8 & 0xffffffff;
      puStack_1d8 = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_1d0._0_8_ != (uv_handle_t *)0x0) goto LAB_001e0ff0;
      if (puVar5 == (uv_loop_t *)0x0) goto LAB_001e0ffd;
      auStack_1d0._0_8_ = (uv_handle_t *)0x4;
      puStack_1d8 = puVar7;
      if (puVar7 != (uv__queue *)0x4) goto LAB_001e1002;
      puStack_1e0 = (uv_handle_t *)0x1e0f2f;
      iVar1 = bcmp("PING",(void *)*extraout_RDX_00,4);
      if (iVar1 != 0) goto LAB_001e100f;
      puStack_1e0 = (uv_handle_t *)0x1e0f3f;
      iVar1 = uv_udp_recv_stop(puVar9);
      auStack_1d0._0_8_ = SEXT48(iVar1);
      puStack_1d8 = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_1d0._0_8_ != (uv_handle_t *)0x0) goto LAB_001e1014;
      puStack_1e0 = (uv_handle_t *)0x1e0f67;
      pvVar3 = malloc(0x148);
      if (pvVar3 == (void *)0x0) goto LAB_001e1021;
      puStack_1e0 = (uv_handle_t *)0x1e0f84;
      auStack_1d0 = uv_buf_init("PONG",4);
      puStack_1e0 = (uv_handle_t *)0x1e0fad;
      in_R8 = puVar5;
      iVar1 = uv_udp_send(pvVar3,puVar9,auStack_1d0,1,puVar5,sv_send_cb);
      puStack_1d8 = (uv__queue *)(long)iVar1;
      p_Stack_1c0 = (uv_alloc_cb)0x0;
      if (puStack_1d8 == (uv__queue *)0x0) {
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return iVar1;
      }
      goto LAB_001e1026;
    }
    iVar1 = 0;
    if (puVar5 == (uv_loop_t *)0x0) {
      return extraout_EAX;
    }
  }
  puStack_1e0 = (uv_handle_t *)cl_send_cb;
  puVar10 = puVar5;
  sv_recv_cb_cold_9();
  if (puVar10 == (uv_loop_t *)0x0) {
    puStack_1f8 = (uv_loop_t *)0x1e10e1;
    cl_send_cb_cold_4();
LAB_001e10e1:
    puStack_1f8 = (uv_loop_t *)0x1e10f0;
    cl_send_cb_cold_1();
LAB_001e10f0:
    puStack_1f8 = (uv_loop_t *)0x1e10ff;
    cl_send_cb_cold_3();
  }
  else {
    puStack_1e0 = (uv_handle_t *)(long)iVar1;
    puStack_1e8 = (uv__queue *)0x0;
    if (puStack_1e0 != (uv_handle_t *)0x0) goto LAB_001e10e1;
    puVar9 = (uv_udp_t *)puVar10->reserved[2];
    puStack_1e0 = (uv_handle_t *)(ulong)(puVar9 == &client || puVar9 == &server);
    puStack_1e8 = (uv__queue *)0x0;
    if (puStack_1e0 == (uv_handle_t *)0x0) goto LAB_001e10f0;
    puStack_1f8 = (uv_loop_t *)0x1e10b5;
    iVar1 = uv_udp_recv_start(puVar9,alloc_cb,cl_recv_cb);
    puStack_1e0 = (uv_handle_t *)(long)iVar1;
    puStack_1e8 = (uv__queue *)0x0;
    if (puStack_1e0 == (uv_handle_t *)0x0) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return iVar1;
    }
  }
  __ptr = &puStack_1e0;
  iVar1 = (int)&puStack_1e8;
  puStack_1f8 = (uv_loop_t *)sv_send_cb;
  cl_send_cb_cold_2();
  puStack_1f8 = puVar5;
  if (__ptr == (uv_handle_t **)0x0) {
    pcStack_210 = (code *)0x1e1196;
    sv_send_cb_cold_3();
LAB_001e1196:
    pcStack_210 = (code *)0x1e11a3;
    sv_send_cb_cold_1();
  }
  else {
    pvStack_200 = (void *)(long)iVar1;
    puStack_208 = (uv_loop_t *)0x0;
    if (pvStack_200 != (void *)0x0) goto LAB_001e1196;
    puVar9 = (uv_udp_t *)__ptr[9];
    pvStack_200 = (void *)(ulong)(puVar9 == &client || puVar9 == &server);
    puStack_208 = (uv_loop_t *)0x0;
    if (pvStack_200 != (void *)0x0) {
      pcStack_210 = (code *)0x1e117d;
      uv_close(puVar9,close_cb);
      pcStack_210 = (code *)0x1e1185;
      free(__ptr);
      sv_send_cb_called = sv_send_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  puVar9 = (uv_udp_t *)&pvStack_200;
  pcStack_210 = close_cb;
  sv_send_cb_cold_2();
  bVar4 = puVar9 == &client || puVar9 == &server;
  lVar6 = CONCAT71(0xffda,bVar4);
  pcStack_210 = (code *)(ulong)bVar4;
  pvStack_218 = (void *)0x0;
  if (pcStack_210 == (code *)0x0) {
    close_cb_cold_2();
  }
  else {
    pcStack_210 = (code *)0x1;
    iVar1 = uv_is_closing();
    pvStack_218 = (void *)(long)iVar1;
    if (pcStack_210 == (code *)pvStack_218) {
      close_cb_called = close_cb_called + 1;
      return (int)pcStack_210;
    }
  }
  puVar9 = (uv_udp_t *)&pcStack_210;
  ppvVar8 = &pvStack_218;
  close_cb_cold_1();
  if (puVar9 == &client || puVar9 == &server) {
    if (((ulong)in_R8 & 0xffffffff) != 0) goto LAB_001e1304;
    if ((long)ppvVar8 < 0) goto LAB_001e1311;
    if (ppvVar8 == (void **)0x0) {
      if (lVar6 == 0) {
        return 0;
      }
      goto LAB_001e132d;
    }
    if (lVar6 == 0) goto LAB_001e1316;
    lVar6 = 4;
    if (ppvVar8 != (void **)0x4) goto LAB_001e131b;
    iVar1 = bcmp("PONG",(void *)*extraout_RDX_01,4);
    if (iVar1 == 0) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      iVar1 = uv_close(puVar9,close_cb);
      return iVar1;
    }
  }
  else {
    cl_recv_cb_cold_7();
LAB_001e1304:
    cl_recv_cb_cold_1();
LAB_001e1311:
    cl_recv_cb_cold_6();
LAB_001e1316:
    cl_recv_cb_cold_4();
LAB_001e131b:
    cl_recv_cb_cold_2();
  }
  cl_recv_cb_cold_3();
LAB_001e132d:
  cl_recv_cb_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(lVar6,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_and_recv) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* client sends "PING", expects "PONG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_send_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);
  ASSERT_OK(sv_recv_cb_called);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, cl_send_cb_called);
  ASSERT_EQ(1, cl_recv_cb_called);
  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}